

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O3

int32_t __thiscall
icu_63::Calendar::getLimit(Calendar *this,UCalendarDateFields field,ELimitType limitType)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  undefined4 in_register_00000034;
  
  if (field < UCAL_FIELD_COUNT) {
    if ((0x75fe80U >> (field & (UCAL_DST_OFFSET|UCAL_ZONE_OFFSET)) & 1) == 0) {
      if (field != UCAL_WEEK_OF_MONTH) goto LAB_001f3090;
      if (limitType != UCAL_LIMIT_GREATEST_MINIMUM) {
        if (limitType == UCAL_LIMIT_MINIMUM) {
          limitType = (ELimitType)(this->fMinimalDaysInFirstWeek == '\x01');
        }
        else {
          bVar1 = this->fMinimalDaysInFirstWeek;
          iVar3 = (*(this->super_UObject)._vptr_UObject[0x1f])(this,5,(ulong)limitType);
          iVar2 = 0xd;
          if (limitType == UCAL_LIMIT_LEAST_MAXIMUM) {
            iVar2 = 7;
          }
          limitType = (int)((iVar2 - (uint)bVar1) + iVar3) / 7;
        }
      }
    }
    else {
      limitType = *(ELimitType *)(kCalendarLimits + (ulong)limitType * 4 + (ulong)field * 0x10);
    }
    return limitType;
  }
LAB_001f3090:
  iVar2 = (*(this->super_UObject)._vptr_UObject[0x1f])
                    (this,CONCAT44(in_register_00000034,field),(ulong)limitType);
  return iVar2;
}

Assistant:

int32_t Calendar::getLimit(UCalendarDateFields field, ELimitType limitType) const {
    switch (field) {
    case UCAL_DAY_OF_WEEK:
    case UCAL_AM_PM:
    case UCAL_HOUR:
    case UCAL_HOUR_OF_DAY:
    case UCAL_MINUTE:
    case UCAL_SECOND:
    case UCAL_MILLISECOND:
    case UCAL_ZONE_OFFSET:
    case UCAL_DST_OFFSET:
    case UCAL_DOW_LOCAL:
    case UCAL_JULIAN_DAY:
    case UCAL_MILLISECONDS_IN_DAY:
    case UCAL_IS_LEAP_MONTH:
        return kCalendarLimits[field][limitType];

    case UCAL_WEEK_OF_MONTH:
        {
            int32_t limit;
            if (limitType == UCAL_LIMIT_MINIMUM) {
                limit = getMinimalDaysInFirstWeek() == 1 ? 1 : 0;
            } else if (limitType == UCAL_LIMIT_GREATEST_MINIMUM) {
                limit = 1;
            } else {
                int32_t minDaysInFirst = getMinimalDaysInFirstWeek();
                int32_t daysInMonth = handleGetLimit(UCAL_DAY_OF_MONTH, limitType);
                if (limitType == UCAL_LIMIT_LEAST_MAXIMUM) {
                    limit = (daysInMonth + (7 - minDaysInFirst)) / 7;
                } else { // limitType == UCAL_LIMIT_MAXIMUM
                    limit = (daysInMonth + 6 + (7 - minDaysInFirst)) / 7;
                }
            }
            return limit;
        }
    default:
        return handleGetLimit(field, limitType);
    }
}